

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocator.cpp
# Opt level: O1

bool __thiscall
LocationToFailAllocNode::shouldFail
          (LocationToFailAllocNode *this,int allocationNumber,char *file,size_t line)

{
  int iVar1;
  
  if (((this->file_ != (char *)0x0) && (iVar1 = SimpleString::StrCmp(file,this->file_), iVar1 == 0))
     && (this->line_ == line)) {
    iVar1 = this->actualAllocNumber_ + 1;
    this->actualAllocNumber_ = iVar1;
    return iVar1 == this->allocNumberToFail_;
  }
  return this->allocNumberToFail_ == allocationNumber;
}

Assistant:

bool shouldFail(int allocationNumber, const char* file, size_t line)
    {
      if (file_ && SimpleString::StrCmp(file, file_) == 0 && line == line_) {
        actualAllocNumber_++;
        return actualAllocNumber_ == allocNumberToFail_;
      }
      if (allocationNumber == allocNumberToFail_)
        return true;
      return false;
    }